

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_atomic_func_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,char *op,Op opcode,
          uint32_t mem_order_1,uint32_t mem_order_2,bool has_mem_order_2,uint32_t obj,uint32_t op1,
          bool op1_is_pointer,bool op1_is_literal,uint32_t op2)

{
  bool bVar1;
  bool bVar2;
  uint32_t id;
  int iVar3;
  SPIRType *type_00;
  CompilerError *pCVar4;
  char *pcVar5;
  BaseType target_type;
  bool local_561;
  undefined1 local_4e8 [40];
  string local_4c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0 [39];
  allocator local_479;
  string local_478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458 [32];
  undefined1 local_438 [64];
  undefined1 local_3f8 [64];
  spirv_cross local_3b8 [32];
  undefined1 local_398 [64];
  spirv_cross local_358 [32];
  undefined1 local_338 [64];
  undefined1 local_2f8 [71];
  bool local_2b1;
  undefined1 local_2b0 [7];
  bool is_atomic_compare_exchange_strong;
  string local_290 [32];
  undefined1 local_270 [40];
  SPIRType *res_type;
  string local_240 [32];
  SPIRVariable *local_220;
  SPIRVariable *var;
  SPIRType remapped_type;
  string local_c0 [36];
  BaseType local_9c;
  SPIRType *pSStack_98;
  BaseType expected_type;
  SPIRType *type;
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [8];
  string exp;
  bool op1_is_literal_local;
  bool op1_is_pointer_local;
  bool has_mem_order_2_local;
  uint32_t mem_order_1_local;
  Op opcode_local;
  char *op_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  bVar2 = op1_is_literal;
  bVar1 = op1_is_pointer;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_78,op,&local_79);
  ::std::operator+(local_58,(char *)local_78);
  ::std::__cxx11::string::~string(local_78);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  type_00 = Compiler::expression_type((Compiler *)this,obj);
  pSStack_98 = Compiler::get_pointee_type((Compiler *)this,type_00);
  local_9c = *(BaseType *)&(pSStack_98->super_IVariant).field_0xc;
  if ((opcode == OpAtomicUMax) || (opcode == OpAtomicUMin)) {
    local_9c = to_unsigned_basetype(pSStack_98->width);
  }
  else if ((opcode == OpAtomicSMax) || (opcode == OpAtomicSMin)) {
    local_9c = to_signed_basetype(pSStack_98->width);
  }
  if (pSStack_98->width == 0x40) {
    remapped_type.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_c0,"MSL currently does not support 64-bit atomics.",
               (allocator *)((long)&remapped_type.member_name_cache._M_h._M_single_bucket + 7));
    CompilerError::CompilerError(pCVar4,(string *)local_c0);
    remapped_type.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  SPIRType::SPIRType((SPIRType *)&var,pSStack_98);
  remapped_type.super_IVariant._vptr_IVariant._4_4_ = local_9c;
  ::std::__cxx11::string::operator+=((string *)local_58,"(");
  local_220 = Compiler::maybe_get_backing_variable((Compiler *)this,obj);
  if (local_220 == (SPIRVariable *)0x0) {
    res_type._6_1_ = 1;
    pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_240,"No backing variable for atomic operation.",
               (allocator *)((long)&res_type + 7));
    CompilerError::CompilerError(pCVar4,(string *)local_240);
    res_type._6_1_ = 0;
    __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_220->super_IVariant).field_0xc);
  local_270._32_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
  if ((((SPIRType *)local_270._32_8_)->storage == StorageClassUniformConstant) &&
     (*(int *)&(((SPIRType *)local_270._32_8_)->super_IVariant).field_0xc == 0x10)) {
    ::std::__cxx11::string::operator+=((string *)local_58,"device");
  }
  else {
    get_argument_address_space_abi_cxx11_((CompilerMSL *)local_270,(SPIRVariable *)this);
    ::std::__cxx11::string::operator+=((string *)local_58,(string *)local_270);
    ::std::__cxx11::string::~string((string *)local_270);
  }
  ::std::__cxx11::string::operator+=((string *)local_58," atomic_");
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_290,this,&var,0);
  ::std::__cxx11::string::operator+=((string *)local_58,local_290);
  ::std::__cxx11::string::~string(local_290);
  ::std::__cxx11::string::operator+=((string *)local_58,"*)");
  ::std::__cxx11::string::operator+=((string *)local_58,"&");
  target_type = (BaseType)this;
  CompilerGLSL::to_enclosed_expression_abi_cxx11_
            ((CompilerGLSL *)local_2b0,target_type,SUB41(obj,0));
  ::std::__cxx11::string::operator+=((string *)local_58,(string *)local_2b0);
  ::std::__cxx11::string::~string((string *)local_2b0);
  local_561 = bVar1 && op1 != 0;
  local_2b1 = local_561;
  if (bVar1 && op1 != 0) {
    iVar3 = strcmp(op,"atomic_compare_exchange_weak_explicit");
    if (iVar3 != 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2534,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (op2 == 0) {
      __assert_fail("op2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2535,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (!has_mem_order_2) {
      __assert_fail("has_mem_order_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x2536,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    ::std::__cxx11::string::operator+=((string *)local_58,", &");
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_2f8 + 0x20,this,(ulong)result_id,1);
    ::std::__cxx11::string::operator+=((string *)local_58,(string *)(local_2f8 + 0x20));
    ::std::__cxx11::string::~string((string *)(local_2f8 + 0x20));
    ::std::__cxx11::string::operator+=((string *)local_58,", ");
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_2f8,target_type,SUB41(op2,0));
    ::std::__cxx11::string::operator+=((string *)local_58,(string *)local_2f8);
    ::std::__cxx11::string::~string((string *)local_2f8);
    ::std::__cxx11::string::operator+=((string *)local_58,", ");
    pcVar5 = get_memory_order(this,mem_order_1);
    ::std::__cxx11::string::operator+=((string *)local_58,pcVar5);
    ::std::__cxx11::string::operator+=((string *)local_58,", ");
    pcVar5 = get_memory_order(this,mem_order_2);
    ::std::__cxx11::string::operator+=((string *)local_58,pcVar5);
    ::std::__cxx11::string::operator+=((string *)local_58,")");
    CompilerGLSL::emit_uninitialized_temporary_expression
              (&this->super_CompilerGLSL,result_type,result_id);
    CompilerGLSL::statement<char_const(&)[3]>(&this->super_CompilerGLSL,(char (*) [3])"do");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_338 + 0x20,this,(ulong)result_id,1);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_338,target_type,SUB41(op1,0));
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_338 + 0x20),(char (*) [4])0x5cb349,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
               (char (*) [2])0x5b3b6f);
    ::std::__cxx11::string::~string((string *)local_338);
    ::std::__cxx11::string::~string((string *)(local_338 + 0x20));
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (local_398 + 0x20,this,(ulong)result_id,1);
    CompilerGLSL::to_enclosed_expression_abi_cxx11_
              ((CompilerGLSL *)local_398,target_type,SUB41(op1,0));
    join<char_const(&)[9],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
              (local_358,(char (*) [9])"while (!",local_58,(char (*) [5])" && ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_398 + 0x20),(char (*) [5])" == ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
               (char (*) [2])0x5b48c4);
    CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL,(string *)local_358);
    ::std::__cxx11::string::~string((string *)local_358);
    ::std::__cxx11::string::~string((string *)local_398);
    ::std::__cxx11::string::~string((string *)(local_398 + 0x20));
  }
  else {
    iVar3 = strcmp(op,"atomic_compare_exchange_weak_explicit");
    if (iVar3 == 0) {
      __assert_fail("strcmp(op, \"atomic_compare_exchange_weak_explicit\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x254f,
                    "void spirv_cross::CompilerMSL::emit_atomic_func_op(uint32_t, uint32_t, const char *, Op, uint32_t, uint32_t, bool, uint32_t, uint32_t, bool, bool, uint32_t)"
                   );
    }
    if (op1 != 0) {
      if (bVar2) {
        join<char_const(&)[3],unsigned_int&>(local_3b8,(char (*) [3])0x5cb8ef,&op1);
        ::std::__cxx11::string::operator+=((string *)local_58,(string *)local_3b8);
        ::std::__cxx11::string::~string((string *)local_3b8);
      }
      else {
        CompilerGLSL::bitcast_expression_abi_cxx11_((CompilerGLSL *)local_3f8,target_type,local_9c);
        ::std::operator+(local_3f8 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x5cb8ef);
        ::std::__cxx11::string::operator+=((string *)local_58,(string *)(local_3f8 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_3f8 + 0x20));
        ::std::__cxx11::string::~string((string *)local_3f8);
      }
    }
    if (op2 != 0) {
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_438,target_type,SUB41(op2,0));
      ::std::operator+(local_438 + 0x20,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5cb8ef
                      );
      ::std::__cxx11::string::operator+=((string *)local_58,(string *)(local_438 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_438 + 0x20));
      ::std::__cxx11::string::~string((string *)local_438);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_478,", ",&local_479);
    get_memory_order(this,mem_order_1);
    ::std::operator+(local_458,(char *)local_478);
    ::std::__cxx11::string::operator+=((string *)local_58,(string *)local_458);
    ::std::__cxx11::string::~string((string *)local_458);
    ::std::__cxx11::string::~string(local_478);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_479);
    if (has_mem_order_2) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4c0,", ",(allocator *)(local_4e8 + 0x27));
      get_memory_order(this,mem_order_2);
      ::std::operator+(local_4a0,(char *)local_4c0);
      ::std::__cxx11::string::operator+=((string *)local_58,(string *)local_4a0);
      ::std::__cxx11::string::~string((string *)local_4a0);
      ::std::__cxx11::string::~string(local_4c0);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_4e8 + 0x27));
    }
    ::std::__cxx11::string::operator+=((string *)local_58,")");
    if (local_9c != *(BaseType *)&(pSStack_98->super_IVariant).field_0xc) {
      CompilerGLSL::bitcast_expression
                ((CompilerGLSL *)local_4e8,(SPIRType *)this,(BaseType)pSStack_98,
                 (string *)(ulong)local_9c);
      ::std::__cxx11::string::operator=((string *)local_58,(string *)local_4e8);
      ::std::__cxx11::string::~string((string *)local_4e8);
    }
    iVar3 = strcmp(op,"atomic_store_explicit");
    if (iVar3 == 0) {
      CompilerGLSL::statement<std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,local_58,(char (*) [2])0x5b3b6f);
    }
    else {
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,result_type,result_id,local_58,false,false);
    }
  }
  Compiler::flush_all_atomic_capable_variables((Compiler *)this);
  SPIRType::~SPIRType((SPIRType *)&var);
  ::std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void CompilerMSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, const char *op, Op opcode,
                                      uint32_t mem_order_1, uint32_t mem_order_2, bool has_mem_order_2, uint32_t obj, uint32_t op1,
                                      bool op1_is_pointer, bool op1_is_literal, uint32_t op2)
{
	string exp = string(op) + "(";

	auto &type = get_pointee_type(expression_type(obj));
	auto expected_type = type.basetype;
	if (opcode == OpAtomicUMax || opcode == OpAtomicUMin)
		expected_type = to_unsigned_basetype(type.width);
	else if (opcode == OpAtomicSMax || opcode == OpAtomicSMin)
		expected_type = to_signed_basetype(type.width);

	if (type.width == 64)
		SPIRV_CROSS_THROW("MSL currently does not support 64-bit atomics.");

	auto remapped_type = type;
	remapped_type.basetype = expected_type;

	exp += "(";
	auto *var = maybe_get_backing_variable(obj);
	if (!var)
		SPIRV_CROSS_THROW("No backing variable for atomic operation.");

	// Emulate texture2D atomic operations
	const auto &res_type = get<SPIRType>(var->basetype);
	if (res_type.storage == StorageClassUniformConstant && res_type.basetype == SPIRType::Image)
	{
		exp += "device";
	}
	else
	{
		exp += get_argument_address_space(*var);
	}

	exp += " atomic_";
	// For signed and unsigned min/max, we can signal this through the pointer type.
	// There is no other way, since C++ does not have explicit signage for atomics.
	exp += type_to_glsl(remapped_type);
	exp += "*)";

	exp += "&";
	exp += to_enclosed_expression(obj);

	bool is_atomic_compare_exchange_strong = op1_is_pointer && op1;

	if (is_atomic_compare_exchange_strong)
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") == 0);
		assert(op2);
		assert(has_mem_order_2);
		exp += ", &";
		exp += to_name(result_id);
		exp += ", ";
		exp += to_expression(op2);
		exp += ", ";
		exp += get_memory_order(mem_order_1);
		exp += ", ";
		exp += get_memory_order(mem_order_2);
		exp += ")";

		// MSL only supports the weak atomic compare exchange, so emit a CAS loop here.
		// The MSL function returns false if the atomic write fails OR the comparison test fails,
		// so we must validate that it wasn't the comparison test that failed before continuing
		// the CAS loop, otherwise it will loop infinitely, with the comparison test always failing.
		// The function updates the comparitor value from the memory value, so the additional
		// comparison test evaluates the memory value against the expected value.
		emit_uninitialized_temporary_expression(result_type, result_id);
		statement("do");
		begin_scope();
		statement(to_name(result_id), " = ", to_expression(op1), ";");
		end_scope_decl(join("while (!", exp, " && ", to_name(result_id), " == ", to_enclosed_expression(op1), ")"));
	}
	else
	{
		assert(strcmp(op, "atomic_compare_exchange_weak_explicit") != 0);
		if (op1)
		{
			if (op1_is_literal)
				exp += join(", ", op1);
			else
				exp += ", " + bitcast_expression(expected_type, op1);
		}
		if (op2)
			exp += ", " + to_expression(op2);

		exp += string(", ") + get_memory_order(mem_order_1);
		if (has_mem_order_2)
			exp += string(", ") + get_memory_order(mem_order_2);

		exp += ")";

		if (expected_type != type.basetype)
			exp = bitcast_expression(type, expected_type, exp);

		if (strcmp(op, "atomic_store_explicit") != 0)
			emit_op(result_type, result_id, exp, false);
		else
			statement(exp, ";");
	}

	flush_all_atomic_capable_variables();
}